

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  size_t sVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  ushort uVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  uivector nextcode;
  uivector blcount;
  uivector local_68;
  uivector local_48;
  
  local_48.data = (uint *)0x0;
  local_48.size = 0;
  local_48.allocsize = 0;
  local_68.data = (uint *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  puVar9 = (uint *)malloc((ulong)tree->numcodes << 2);
  sVar7 = local_48.size;
  tree->tree1d = puVar9;
  uVar12 = 0x53;
  if (puVar9 != (uint *)0x0) {
    uVar12 = 0;
  }
  uVar10 = (ulong)(tree->maxbitlen + 1);
  uVar8 = uivector_resize(&local_48,uVar10);
  if (((sVar7 <= uVar10 && uVar10 - sVar7 != 0) & (byte)uVar8) == 1) {
    memset(local_48.data + sVar7,0,(uVar10 - sVar7) * 4);
  }
  sVar7 = local_68.size;
  if (uVar8 != 0) {
    uVar10 = (ulong)(tree->maxbitlen + 1);
    uVar8 = uivector_resize(&local_68,uVar10);
    if (((sVar7 <= uVar10 && uVar10 - sVar7 != 0) & (byte)uVar8) == 1) {
      memset(local_68.data + sVar7,0,(uVar10 - sVar7) * 4);
    }
    if (uVar8 != 0) goto LAB_002c4792;
  }
  uVar12 = 0x53;
LAB_002c4792:
  if (uVar12 == 0) {
    if (tree->numcodes != 0) {
      puVar9 = tree->lengths;
      uVar10 = 0;
      do {
        local_48.data[puVar9[uVar10]] = local_48.data[puVar9[uVar10]] + 1;
        uVar12 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar12;
      } while (uVar12 != tree->numcodes);
    }
    if (tree->maxbitlen != 0) {
      uVar10 = 1;
      do {
        uVar12 = (int)uVar10 - 1;
        local_68.data[uVar10] = (local_48.data[uVar12] + local_68.data[uVar12]) * 2;
        uVar12 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar12;
      } while (uVar12 <= tree->maxbitlen);
    }
    if (tree->numcodes != 0) {
      puVar9 = tree->lengths;
      uVar12 = 0;
      do {
        uVar10 = (ulong)puVar9[uVar12];
        if (uVar10 != 0) {
          uVar8 = local_68.data[uVar10];
          local_68.data[uVar10] = uVar8 + 1;
          tree->tree1d[uVar12] = uVar8;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != tree->numcodes);
    }
    local_48.size = 0;
    local_48.allocsize = 0;
    free(local_48.data);
    local_48.data = (uint *)0x0;
    local_68.size = 0;
    local_68.allocsize = 0;
    free(local_68.data);
    local_68.data = (uint *)0x0;
    uVar12 = tree->numcodes;
    uVar10 = (ulong)(uVar12 * 2);
    puVar9 = (uint *)malloc(uVar10 * 4);
    tree->tree2d = puVar9;
    if (puVar9 == (uint *)0x0) {
      uVar12 = 0x53;
    }
    else {
      if (uVar10 != 0) {
        auVar20 = vpbroadcastq_avx512f();
        uVar11 = 0;
        auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar23 = vpbroadcastd_avx512f(ZEXT416(0x7fff));
        do {
          auVar24 = vpbroadcastq_avx512f();
          auVar25 = vporq_avx512f(auVar24,auVar21);
          auVar24 = vporq_avx512f(auVar24,auVar22);
          vpcmpuq_avx512f(auVar24,auVar20,2);
          vpcmpuq_avx512f(auVar25,auVar20,2);
          auVar24 = vmovdqu32_avx512f(auVar23);
          *(undefined1 (*) [64])(puVar9 + uVar11) = auVar24;
          uVar11 = uVar11 + 0x10;
        } while ((uVar10 + 0xf & 0xfffffffffffffff0) != uVar11);
      }
      if ((ulong)uVar12 != 0) {
        puVar2 = tree->lengths;
        uVar11 = 0;
        iVar14 = 0;
        iVar13 = 0;
        do {
          uVar8 = puVar2[uVar11];
          if (uVar8 != 0) {
            puVar3 = tree->tree1d;
            iVar15 = -1;
            uVar16 = 1;
            do {
              bVar18 = iVar14 < 0;
              bVar17 = uVar12 < iVar14 + 2U;
              if (!bVar17 && !bVar18) {
                uVar1 = (puVar3[uVar11] >> (uVar8 + iVar15 & 0x1f) & 1) + iVar14 * 2;
                if (puVar9[uVar1] == 0x7fff) {
                  if (uVar16 == uVar8) {
                    puVar9[uVar1] = (uint)uVar11;
                    iVar14 = 0;
                  }
                  else {
                    iVar14 = iVar13 + 1;
                    puVar9[uVar1] = iVar13 + 1 + uVar12;
                    iVar13 = iVar14;
                  }
                }
                else {
                  iVar14 = puVar9[uVar1] - uVar12;
                }
              }
              if (bVar17 || bVar18) {
                return 0x37;
              }
              uVar8 = puVar2[uVar11];
              iVar15 = iVar15 + -1;
              bVar17 = uVar16 != uVar8;
              uVar16 = uVar16 + 1;
            } while (bVar17);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar12);
      }
      if (uVar12 * 2 == 0) {
        uVar12 = 0;
      }
      else {
        auVar20 = vpbroadcastq_avx512f();
        uVar12 = 0;
        auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar23 = vpbroadcastd_avx512f(ZEXT416(0x7fff));
        uVar11 = 0;
        do {
          auVar24 = vpbroadcastq_avx512f();
          auVar25 = vporq_avx512f(auVar24,auVar21);
          auVar24 = vporq_avx512f(auVar24,auVar22);
          uVar4 = vpcmpuq_avx512f(auVar24,auVar20,2);
          uVar5 = vpcmpuq_avx512f(auVar25,auVar20,2);
          bVar6 = (byte)uVar5;
          uVar19 = CONCAT11(bVar6,(byte)uVar4);
          auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar9 + uVar11));
          auVar25._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar24._4_4_;
          auVar25._0_4_ = (uint)((byte)uVar4 & 1) * auVar24._0_4_;
          auVar25._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar24._8_4_;
          auVar25._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar24._12_4_;
          auVar25._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar24._16_4_;
          auVar25._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar24._20_4_;
          auVar25._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar24._24_4_;
          auVar25._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar24._28_4_;
          auVar25._32_4_ = (uint)(bVar6 & 1) * auVar24._32_4_;
          auVar25._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar24._36_4_;
          auVar25._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar24._40_4_;
          auVar25._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar24._44_4_;
          auVar25._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar24._48_4_;
          auVar25._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar24._52_4_;
          auVar25._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar24._56_4_;
          auVar25._60_4_ = (uint)(bVar6 >> 7) * auVar24._60_4_;
          vpcmpeqd_avx512f(auVar25,auVar23);
          auVar24 = vmovdqu32_avx512f(ZEXT1664((undefined1  [16])0x0));
          *(undefined1 (*) [64])(puVar9 + uVar11) = auVar24;
          uVar11 = uVar11 + 0x10;
        } while ((uVar10 + 0xf & 0xfffffffffffffff0) != uVar11);
      }
    }
  }
  else {
    local_48.size = 0;
    local_48.allocsize = 0;
    free(local_48.data);
    local_48.data = (uint *)0x0;
    local_68.size = 0;
    local_68.allocsize = 0;
    free(local_68.data);
  }
  return uVar12;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned error = 0;
  unsigned bits, n;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}